

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageWhiteNoise(Image *__return_storage_ptr__,int width,int height,float factor)

{
  int iVar1;
  void *pvVar2;
  int local_24;
  int i;
  Color *pixels;
  float factor_local;
  int height_local;
  int width_local;
  
  pvVar2 = malloc((long)(width * height) << 2);
  for (local_24 = 0; local_24 < width * height; local_24 = local_24 + 1) {
    iVar1 = GetRandomValue(0,99);
    if (iVar1 < (int)(factor * 100.0)) {
      *(undefined4 *)((long)pvVar2 + (long)local_24 * 4) = 0xffffffff;
    }
    else {
      *(undefined4 *)((long)pvVar2 + (long)local_24 * 4) = 0xff000000;
    }
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageWhiteNoise(int width, int height, float factor)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width*height; i++)
    {
        if (GetRandomValue(0, 99) < (int)(factor*100.0f)) pixels[i] = WHITE;
        else pixels[i] = BLACK;
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}